

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

string * __thiscall
sing::HttpResponse::getFileType_abi_cxx11_(string *__return_storage_ptr__,HttpResponse *this)

{
  size_type sVar1;
  pointer ppVar2;
  allocator<char> local_65;
  undefined4 local_64;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  undefined1 local_58 [8];
  string suffix;
  allocator<char> local_21;
  long local_20;
  size_type idx;
  HttpResponse *this_local;
  
  idx = (size_type)this;
  this_local = (HttpResponse *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char)this + -0x60,0x2e);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"text/plain",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)&this->path);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count(&suffix2Type_abi_cxx11_,(key_type *)local_58);
    if (sVar1 == 1) {
      local_60._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&suffix2Type_abi_cxx11_,(key_type *)local_58);
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_60);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"text/plain",&local_65);
      std::allocator<char>::~allocator(&local_65);
    }
    local_64 = 1;
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpResponse::getFileType(){
    string::size_type idx = path.find_last_of('.');
    if(idx == string::npos) {
        return "text/plain";
    }
    string suffix = path.substr(idx);
    if(suffix2Type.count(suffix) == 1) {
        return suffix2Type.find(suffix)->second;
    }
    return "text/plain";
}